

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MNIST.cpp
# Opt level: O0

void __thiscall MNIST::read_next(MNIST *this)

{
  long local_30;
  size_t i_1;
  long lStack_20;
  char label;
  size_t i;
  MNIST *pMStack_10;
  num_t inv;
  MNIST *this_local;
  
  pMStack_10 = this;
  std::istream::read((char *)this->images_,(long)this->buf_);
  i._4_4_ = 0x3b808081;
  for (lStack_20 = 0; lStack_20 != 0x310; lStack_20 = lStack_20 + 1) {
    this->data_[lStack_20] = (float)(byte)this->buf_[lStack_20] * 0.003921569;
  }
  std::istream::read((char *)this->labels_,(long)&i_1 + 7);
  for (local_30 = 0; local_30 != 10; local_30 = local_30 + 1) {
    this->label_[local_30] = 0.0;
  }
  this->label_[i_1._7_1_] = 1.0;
  return;
}

Assistant:

void MNIST::read_next()
{
    images_.read(buf_, DIM);
    num_t inv = num_t{1.0} / num_t{255.0};
    for (size_t i = 0; i != DIM; ++i)
    {
        data_[i] = static_cast<uint8_t>(buf_[i]) * inv;
    }

    char label;
    labels_.read(&label, 1);

    for (size_t i = 0; i != 10; ++i)
    {
        label_[i] = num_t{0.0};
    }
    label_[static_cast<uint8_t>(label)] = num_t{1.0};
}